

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall Session::resetOp(Session *this)

{
  long *plVar1;
  CryptoFactory *pCVar2;
  FindOperation *in_RDI;
  
  if (in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left != (_Base_ptr)0x0) {
    free(in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  }
  if (in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0) {
    if (in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
    {
      if (*(long *)&in_RDI[2]._handles._M_t._M_impl == 0) {
        if (*(long *)&in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
          if (in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            if (in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                (_Base_ptr)0x0) {
              plVar1 = (long *)in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_node_count;
              (**(code **)(*plVar1 + 0x50))
                        (plVar1,in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent);
              in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
            }
            pCVar2 = CryptoFactory::i();
            (*pCVar2->_vptr_CryptoFactory[7])
                      (pCVar2,in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_node_count);
            in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          }
        }
        else {
          if (in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            plVar1 = *(long **)&in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header;
            (**(code **)(*plVar1 + 0x50))
                      (plVar1,in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent);
            in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
          }
          pCVar2 = CryptoFactory::i();
          (*pCVar2->_vptr_CryptoFactory[1])
                    (pCVar2,*(undefined8 *)
                             &in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header);
          *(undefined8 *)&in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_header = 0;
        }
      }
      else {
        if (*(long *)&in_RDI[3]._handles._M_t._M_impl != 0) {
          plVar1 = *(long **)&in_RDI[2]._handles._M_t._M_impl;
          (**(code **)(*plVar1 + 0xd0))(plVar1,*(undefined8 *)&in_RDI[3]._handles._M_t._M_impl);
          *(undefined8 *)&in_RDI[3]._handles._M_t._M_impl = 0;
        }
        if (*(long *)&in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
          plVar1 = *(long **)&in_RDI[2]._handles._M_t._M_impl;
          (**(code **)(*plVar1 + 0xd8))
                    (plVar1,*(undefined8 *)
                             &in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header);
          *(undefined8 *)&in_RDI[3]._handles._M_t._M_impl.super__Rb_tree_header._M_header = 0;
        }
        pCVar2 = CryptoFactory::i();
        (*pCVar2->_vptr_CryptoFactory[3])(pCVar2,*(undefined8 *)&in_RDI[2]._handles._M_t._M_impl);
        *(undefined8 *)&in_RDI[2]._handles._M_t._M_impl = 0;
      }
    }
    else {
      FindOperation::recycle(in_RDI);
      in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    }
  }
  else {
    pCVar2 = CryptoFactory::i();
    (*pCVar2->_vptr_CryptoFactory[5])
              (pCVar2,in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  }
  in_RDI[1]._handles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(undefined1 *)&in_RDI[2]._handles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void Session::resetOp()
{
	if (param != NULL)
	{
		free(param);
		param = NULL;
		paramLen = 0;
	}

	if (digestOp != NULL)
	{
		CryptoFactory::i()->recycleHashAlgorithm(digestOp);
		digestOp = NULL;
	}
	else if (findOp != NULL)
	{
		findOp->recycle();
		findOp = NULL;
	}
	else if (asymmetricCryptoOp != NULL)
	{
		if (publicKey != NULL)
		{
			asymmetricCryptoOp->recyclePublicKey(publicKey);
			publicKey = NULL;
		}
		if (privateKey != NULL)
		{
			asymmetricCryptoOp->recyclePrivateKey(privateKey);
			privateKey = NULL;
		}
		CryptoFactory::i()->recycleAsymmetricAlgorithm(asymmetricCryptoOp);
		asymmetricCryptoOp = NULL;
	}
	else if (symmetricCryptoOp != NULL)
	{
		if (symmetricKey != NULL)
		{
			symmetricCryptoOp->recycleKey(symmetricKey);
			symmetricKey = NULL;
		}
		CryptoFactory::i()->recycleSymmetricAlgorithm(symmetricCryptoOp);
		symmetricCryptoOp = NULL;
	}
	else if (macOp != NULL)
	{
		if (symmetricKey != NULL)
		{
			macOp->recycleKey(symmetricKey);
			symmetricKey = NULL;
		}
		CryptoFactory::i()->recycleMacAlgorithm(macOp);
		macOp = NULL;
	}

	operation = SESSION_OP_NONE;
	reAuthentication = false;
}